

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O2

void __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::ThreeAxisForceTorqueContactSensor
          (ThreeAxisForceTorqueContactSensor *this,ThreeAxisForceTorqueContactSensor *other)

{
  ThreeAxisForceTorqueContactSensorPrivateAttributes *this_00;
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__ThreeAxisForceTorqueContactSensor_001e6b58;
  this_00 = (ThreeAxisForceTorqueContactSensorPrivateAttributes *)operator_new(0xc0);
  ThreeAxisForceTorqueContactSensorPrivateAttributes::
  ThreeAxisForceTorqueContactSensorPrivateAttributes(this_00,other->pimpl);
  this->pimpl = this_00;
  return;
}

Assistant:

ThreeAxisForceTorqueContactSensor::ThreeAxisForceTorqueContactSensor(const ThreeAxisForceTorqueContactSensor& other):
    pimpl(new ThreeAxisForceTorqueContactSensorPrivateAttributes(*(other.pimpl)))
{

}